

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
::fulfill(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
          *this,Pipeline *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ExceptionOr<capnp::AnyPointer::Pipeline> local_198;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_198.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_198.value.ptr.isSet = true;
    local_198.value.ptr.field_1.value.hook.disposer = (value->hook).disposer;
    local_198.value.ptr.field_1.value.hook.ptr = (value->hook).ptr;
    (value->hook).ptr = (PipelineHook *)0x0;
    local_198.value.ptr.field_1.value.ops.ptr = (value->ops).ptr;
    local_198.value.ptr.field_1.value.ops.size_ = (value->ops).size_;
    local_198.value.ptr.field_1.value.ops.disposer = (value->ops).disposer;
    (value->ops).ptr = (PipelineOp *)0x0;
    (value->ops).size_ = 0;
    ExceptionOr<capnp::AnyPointer::Pipeline>::operator=(&this->result,&local_198);
    uVar2 = local_198.value.ptr.field_1.value.ops.size_;
    uVar1 = local_198.value.ptr.field_1.value.ops.ptr;
    if (local_198.value.ptr.isSet == true) {
      if (local_198.value.ptr.field_1.value.ops.ptr != (PipelineOp *)0x0) {
        local_198.value.ptr.field_1.value.ops.ptr = (PipelineOp *)0x0;
        local_198.value.ptr.field_1.value.ops.size_ = 0;
        (*(code *)**(undefined8 **)local_198.value.ptr.field_1.value.ops.disposer)
                  (local_198.value.ptr.field_1.value.ops.disposer,uVar1,8,uVar2,uVar2,0);
      }
      uVar1 = local_198.value.ptr.field_1.value.hook.ptr;
      if (local_198.value.ptr.field_1.value.hook.ptr != (PipelineHook *)0x0) {
        local_198.value.ptr.field_1.value.hook.ptr = (PipelineHook *)0x0;
        (**(local_198.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                  (local_198.value.ptr.field_1.value.hook.disposer,
                   (_func_int *)
                   ((long)&((PipelineHook *)uVar1)->_vptr_PipelineHook +
                   (long)((PipelineHook *)uVar1)->_vptr_PipelineHook[-2]));
      }
    }
    if (local_198.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_198.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }